

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.h
# Opt level: O3

void * __thiscall re2::Prog::PrefixAccel(Prog *this,void *data,size_t size)

{
  int __c;
  int iVar1;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint64_t *puVar13;
  ulong uVar14;
  
  if (this->prefix_size_ == 0) {
    __assert_fail("can_prefix_accel()",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/prog.h"
                  ,0xe0,"const void *re2::Prog::PrefixAccel(const void *, size_t)");
  }
  if (this->prefix_foldcase_ != true) {
    if (this->prefix_size_ == 1) {
      pvVar3 = memchr(data,(this->field_11).field_1.prefix_front_,size);
      return pvVar3;
    }
    uVar2 = this->prefix_size_;
    if (uVar2 < 2) {
      __assert_fail("(prefix_size_) >= (2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/prog.cc"
                    ,0x46b,"const void *re2::Prog::PrefixAccel_FrontAndBack(const void *, size_t)");
    }
    if (uVar2 <= size) {
      uVar6 = (size - uVar2) + 1;
      __c = (this->field_11).field_1.prefix_front_;
      iVar1 = (this->field_11).field_1.prefix_back_;
      uVar4 = 0;
      pvVar3 = data;
      while (pvVar3 = memchr(pvVar3,__c,uVar6 - uVar4), pvVar3 != (void *)0x0) {
        if (iVar1 == *(char *)((long)pvVar3 + (uVar2 - 1))) {
          return pvVar3;
        }
        pvVar3 = (void *)((long)pvVar3 + 1);
        uVar4 = (long)pvVar3 - (long)data;
        if (uVar6 < uVar4) {
          __assert_fail("(size) >= (static_cast<size_t>(p-p0))",
                        "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/prog.cc"
                        ,0x490,
                        "const void *re2::Prog::PrefixAccel_FrontAndBack(const void *, size_t)");
        }
      }
    }
    return (void *)0x0;
  }
  uVar2 = this->prefix_size_;
  if (size < uVar2) {
    return (void *)0x0;
  }
  if (size < 8) {
    puVar13 = (this->field_11).prefix_dfa_;
    uVar4 = 0;
  }
  else {
    pbVar5 = (byte *)((size & 0xfffffffffffffff8) + (long)data);
    puVar13 = (this->field_11).prefix_dfa_;
    uVar4 = 0;
    do {
      uVar14 = puVar13[*data] >> ((byte)uVar4 & 0x3f);
      uVar6 = puVar13[*(byte *)((long)data + 1)] >> ((byte)uVar14 & 0x3f);
      uVar12 = puVar13[*(byte *)((long)data + 2)] >> ((byte)uVar6 & 0x3f);
      uVar11 = puVar13[*(byte *)((long)data + 3)] >> ((byte)uVar12 & 0x3f);
      uVar10 = puVar13[*(byte *)((long)data + 4)] >> ((byte)uVar11 & 0x3f);
      uVar9 = puVar13[*(byte *)((long)data + 5)] >> ((byte)uVar10 & 0x3f);
      uVar7 = puVar13[*(byte *)((long)data + 6)] >> ((byte)uVar9 & 0x3f);
      uVar4 = puVar13[*(byte *)((long)data + 7)] >> ((byte)uVar7 & 0x3f);
      if (((uint)uVar4 & 0x3f) == 0x36) {
        if ((0x36U - (int)uVar14 & 0x3f) == 0) {
          return (byte *)((long)data + (1 - uVar2));
        }
        if ((0x36U - (int)uVar6 & 0x3f) == 0) {
          return (byte *)((long)data + (2 - uVar2));
        }
        if ((0x36U - (int)uVar12 & 0x3f) == 0) {
          return (byte *)((long)data + (3 - uVar2));
        }
        if ((0x36U - (int)uVar11 & 0x3f) != 0) {
          if ((0x36U - (int)uVar10 & 0x3f) == 0) {
            return (byte *)((long)data + (5 - uVar2));
          }
          if ((0x36U - (int)uVar9 & 0x3f) != 0) {
            if ((0x36U - (int)uVar7 & 0x3f) != 0) {
              return (byte *)((long)data + (8 - uVar2));
            }
            return (byte *)((long)data + (7 - uVar2));
          }
          return (byte *)((long)data + (6 - uVar2));
        }
        return (byte *)((long)data + (4 - uVar2));
      }
      data = (void *)((long)data + 8);
    } while ((byte *)data != pbVar5);
    size = (size_t)((uint)size & 7);
    data = pbVar5;
  }
  sVar8 = 0;
  do {
    if (size == sVar8) {
      return (void *)0x0;
    }
    uVar4 = puVar13[*(byte *)((long)data + sVar8)] >> ((byte)uVar4 & 0x3f);
    sVar8 = sVar8 + 1;
  } while (((uint)uVar4 & 0x3f) != 0x36);
  return (byte *)((long)data + (sVar8 - uVar2));
}

Assistant:

bool can_prefix_accel() { return prefix_size_ != 0; }